

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O3

void __thiscall de::SpinBarrier::sync(SpinBarrier *this)

{
  deInt32 *pdVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint in_ESI;
  
  uVar3 = this->m_numThreads;
  uVar4 = (uint)(this->m_numCores < uVar3);
  if (in_ESI != 2) {
    uVar4 = in_ESI;
  }
  if (0 < this->m_numLeaving) {
    while (this->m_numLeaving != 0) {
      if (uVar4 == 1) {
        deYield();
      }
    }
  }
  LOCK();
  pdVar1 = &this->m_numEntered;
  iVar2 = *pdVar1;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  if (iVar2 + 1U == uVar3) {
    this->m_numThreads = this->m_numThreads - this->m_numRemoved;
    this->m_numLeaving = this->m_numThreads;
    this->m_numRemoved = 0;
    this->m_numEntered = 0;
  }
  else {
    while (this->m_numEntered != 0) {
      if (uVar4 == 1) {
        deYield();
      }
    }
  }
  LOCK();
  this->m_numLeaving = this->m_numLeaving + -1;
  UNLOCK();
  return;
}

Assistant:

void SpinBarrier::sync (WaitMode requestedMode)
{
	const deInt32	cachedNumThreads	= m_numThreads;
	const WaitMode	waitMode			= getWaitMode(requestedMode, m_numCores, cachedNumThreads);

	deMemoryReadWriteFence();

	// m_numEntered must not be touched until all threads have had
	// a chance to observe it being 0.
	if (m_numLeaving > 0)
	{
		for (;;)
		{
			if (m_numLeaving == 0)
				break;

			wait(waitMode);
		}
	}

	// If m_numRemoved > 0, m_numThreads will decrease. If m_numThreads is decreased
	// just after atomicOp and before comparison, the branch could be taken by multiple
	// threads. Since m_numThreads only changes if all threads are inside the spinbarrier,
	// cached value at snapshotted at the beginning of the function will be equal for
	// all threads.
	if (deAtomicIncrement32(&m_numEntered) == cachedNumThreads)
	{
		// Release all waiting threads. Since this thread has not been removed, m_numLeaving will
		// be >= 1 until m_numLeaving is decremented at the end of this function.
		m_numThreads -= m_numRemoved;
		m_numLeaving  = m_numThreads;
		m_numRemoved  = 0;

		deMemoryReadWriteFence();
		m_numEntered  = 0;
	}
	else
	{
		for (;;)
		{
			if (m_numEntered == 0)
				break;

			wait(waitMode);
		}
	}

	deAtomicDecrement32(&m_numLeaving);
	deMemoryReadWriteFence();
}